

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O1

unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> __thiscall
llbuild::basic::DeviceAgnosticFileSystem::from
          (DeviceAgnosticFileSystem *this,
          unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
          *fs)

{
  FileSystem *pFVar1;
  _func_int **pp_Var2;
  
  pp_Var2 = (_func_int **)operator_new(0x10);
  pFVar1 = (fs->_M_t).
           super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
           .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
  (fs->_M_t).
  super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
  .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl = (FileSystem *)0x0;
  *pp_Var2 = (_func_int *)&PTR__DeviceAgnosticFileSystem_0025b180;
  pp_Var2[1] = (_func_int *)pFVar1;
  (this->super_FileSystem)._vptr_FileSystem = pp_Var2;
  return (__uniq_ptr_data<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>,_true,_true>
          )(__uniq_ptr_data<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FileSystem>
basic::DeviceAgnosticFileSystem::from(std::unique_ptr<FileSystem> fs) {
  return llvm::make_unique<DeviceAgnosticFileSystem>(std::move(fs));
}